

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O1

void __thiscall
wasm::
AnalysisChecker<wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_wasm::analysis::ReachingDefinitionsTransferFunction>
::checkMonotonicity(AnalysisChecker<wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_wasm::analysis::ReachingDefinitionsTransferFunction>
                    *this,BasicBlock *bb,Element *first,Element *second,Element *firstResult,
                   Element *secondResult)

{
  LatticeComparison LVar1;
  LatticeComparison LVar2;
  Fatal local_378;
  stringstream local_1f0 [8];
  stringstream ss;
  undefined1 local_1e0 [376];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  BasicBlock *local_48;
  __node_base local_40;
  Element *local_38;
  
  local_48 = bb;
  local_38 = second;
  LVar1 = analysis::FinitePowersetLattice<wasm::LocalSet_*>::compare(this->lattice,first,second);
  local_40._M_nxt = (_Hash_node_base *)secondResult;
  LVar2 = analysis::FinitePowersetLattice<wasm::LocalSet_*>::compare
                    (this->lattice,firstResult,secondResult);
  if (LVar1 != NO_RELATION) {
    if (LVar1 == GREATER) {
      if ((LVar2 & ~LESS) == EQUAL) {
        return;
      }
    }
    else if ((LVar1 == LESS) && (LVar2 - EQUAL < 2)) {
      return;
    }
    if ((LVar1 != EQUAL) || (LVar2 != EQUAL)) {
      std::__cxx11::stringstream::stringstream(local_1f0);
      printFailureInfo(this,(ostream *)local_1e0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0,"Elements ",9);
      analysis::FiniteIntPowersetLattice::Element::print(first,(ostream *)local_1e0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0," -> ",4);
      analysis::FiniteIntPowersetLattice::Element::print(firstResult,(ostream *)local_1e0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0," and ",5);
      analysis::FiniteIntPowersetLattice::Element::print(local_38,(ostream *)local_1e0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0," -> ",4);
      analysis::FiniteIntPowersetLattice::Element::print
                ((Element *)local_40._M_nxt,(ostream *)local_1e0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e0,
                 "\n show that the transfer function is not monotone when given the input:\n",0x48);
      wasm::analysis::BasicBlock::print((ostream *)local_48,(Module *)local_1e0,0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0,"\n",1);
      Fatal::Fatal(&local_378);
      std::__cxx11::stringbuf::str();
      Fatal::operator<<(&local_378,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_1e0 + 0x178));
      std::__cxx11::string::~string((string *)(local_1e0 + 0x178));
      Fatal::~Fatal(&local_378);
    }
  }
  return;
}

Assistant:

void checkMonotonicity(const BasicBlock& bb,
                         typename L::Element& first,
                         typename L::Element& second,
                         typename L::Element& firstResult,
                         typename L::Element& secondResult) {
    LatticeComparison beforeCmp = lattice.compare(first, second);
    LatticeComparison afterCmp = lattice.compare(firstResult, secondResult);

    // Cases in which monotonicity is preserved.
    if (beforeCmp == LatticeComparison::NO_RELATION) {
      // If there is no relation in the first place, we can't expect anything.
      return;
    } else if (beforeCmp == LatticeComparison::LESS &&
               (afterCmp == LatticeComparison::LESS ||
                afterCmp == LatticeComparison::EQUAL)) {
      // x < y and f(x) <= f(y)
      return;
    } else if (beforeCmp == LatticeComparison::GREATER &&
               (afterCmp == LatticeComparison::GREATER ||
                afterCmp == LatticeComparison::EQUAL)) {
      // x > y and f(x) >= f(y)
      return;
    } else if (beforeCmp == LatticeComparison::EQUAL &&
               afterCmp == LatticeComparison::EQUAL) {
      // x = y and f(x) = f(y)
      return;
    }

    std::stringstream ss;
    printFailureInfo(ss);

    ss << "Elements ";
    first.print(ss);
    ss << " -> ";
    firstResult.print(ss);
    ss << " and ";
    second.print(ss);
    ss << " -> ";
    secondResult.print(ss);
    ss << "\n show that the transfer function is not monotone when given the "
          "input:\n";
    bb.print(ss);
    ss << "\n";

    Fatal() << ss.str();
  }